

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fctstr_ieq(char *s1,char *s2)

{
  char *pcVar1;
  __int32_t *p_Var2;
  __int32_t **pp_Var3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = 1;
  if (s1 != s2) {
    if ((s1 != (char *)0x0 || s2 == (char *)0x0) && (s1 == (char *)0x0 || s2 != (char *)0x0)) {
      pp_Var3 = __ctype_tolower_loc();
      p_Var2 = *pp_Var3;
      lVar4 = (long)*s1;
      if (p_Var2[lVar4] == p_Var2[*s2]) {
        lVar5 = 1;
        do {
          if ((char)lVar4 == '\0') {
            return 1;
          }
          lVar4 = (long)s1[lVar5];
          pcVar1 = s2 + lVar5;
          lVar5 = lVar5 + 1;
        } while (p_Var2[lVar4] == p_Var2[*pcVar1]);
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int
fctstr_ieq(char const *s1, char const *s2)
{
    if ( s1 == s2 )
    {
        return 1;
    }
    if ( (s1 == NULL && s2 != NULL)
            || (s1 != NULL && s2 == NULL) )
    {
        return 0;
    }
    while (tolower(*s1) == tolower(*s2))
    {
        if (*s1 == '\0')
            return 1;
        s1++;
        s2++;
    }
    /* Difference detected! */
    return 0;
}